

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_f1a6f8::ResolvePath(anon_unknown_dwarf_f1a6f8 *this,Value *json,Args path)

{
  optional<(anonymous_namespace)::Args> errorPath;
  optional<(anonymous_namespace)::Args> errorPath_00;
  bool bVar1;
  ArrayIndex max;
  int index_00;
  ValueType type;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  json_error *pjVar4;
  _Storage<(anonymous_namespace)::Args,_true> local_1f0;
  undefined8 local_1e0;
  string_view local_1d8;
  string_view local_1c8;
  string_view local_1b8;
  string_view local_1a8;
  string local_198;
  string_view local_178;
  size_t local_168;
  char *pcStack_160;
  undefined1 local_158 [8];
  string progressStr_1;
  _Storage<(anonymous_namespace)::Args,_true> local_130;
  undefined8 local_120;
  string_view local_118 [2];
  string_view local_f8;
  string local_e8;
  string_view local_c8;
  size_t local_b8;
  char *pcStack_b0;
  undefined1 local_a0 [8];
  string progressStr;
  int index;
  undefined1 local_50 [8];
  Args progress;
  string *field;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  curr;
  Value *search;
  Value *json_local;
  Args path_local;
  
  path_local.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .Begin = path.
           super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .Begin._M_current;
  curr._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  json_local = json;
  local_30 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&json_local);
  do {
    field = (string *)
            cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&json_local);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&field);
    if (!bVar1) {
      return (Value *)curr._M_current;
    }
    progress.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&local_30);
    _Var2 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&json_local);
    _Var3 = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator+(&local_30,1);
    Args::cmRange((Args *)local_50,_Var2,_Var3);
    bVar1 = Json::Value::isArray((Value *)curr._M_current);
    _Var2 = progress.
            super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .End;
    if (bVar1) {
      std::optional<(anonymous_namespace)::Args>::optional<(anonymous_namespace)::Args_&,_true>
                ((optional<(anonymous_namespace)::Args> *)((long)&progressStr.field_2 + 8),
                 (Args *)local_50);
      max = Json::Value::size((Value *)curr._M_current);
      index_00 = ParseIndex(_Var2._M_current,
                            (optional<(anonymous_namespace)::Args> *)
                            ((long)&progressStr.field_2 + 8),max);
      curr._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Json::Value::operator[](curr._M_current,index_00);
    }
    else {
      bVar1 = Json::Value::isObject((Value *)curr._M_current);
      if (!bVar1) {
        local_178 = (string_view)::cm::operator____s(" ",1);
        local_168 = local_178._M_len;
        pcStack_160 = local_178._M_str;
        cmJoin<(anonymous_namespace)::Args>((string *)local_158,(Args *)local_50,local_178);
        pjVar4 = (json_error *)__cxa_allocate_exception(0x28);
        local_1a8 = (string_view)::cm::operator____s("invalid path \'",0xe);
        local_1b8 = (string_view)
                    ::cm::operator____s("\', need element of OBJECT or ARRAY type to lookup \'",0x33
                                       );
        _Var2 = progress.
                super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .End;
        local_1c8 = (string_view)::cm::operator____s("\' got ",6);
        type = Json::Value::type((Value *)curr._M_current);
        local_1d8 = JsonTypeToString(type);
        cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>
                  (&local_198,(static_string_view *)&local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   (static_string_view *)&local_1b8,_Var2._M_current,
                   (static_string_view *)&local_1c8,&local_1d8);
        std::optional<(anonymous_namespace)::Args>::optional<(anonymous_namespace)::Args_&,_true>
                  ((optional<(anonymous_namespace)::Args> *)&local_1f0._M_value,(Args *)local_50);
        errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current =
             local_1f0._M_value.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .End._M_current;
        errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current =
             local_1f0._M_value.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .Begin._M_current;
        errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = local_1e0;
        json_error::json_error(pjVar4,&local_198,errorPath_00);
        __cxa_throw(pjVar4,&(anonymous_namespace)::json_error::typeinfo,json_error::~json_error);
      }
      bVar1 = Json::Value::isMember
                        ((Value *)curr._M_current,
                         progress.
                         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .End._M_current);
      if (!bVar1) {
        local_c8 = (string_view)::cm::operator____s(" ",1);
        local_b8 = local_c8._M_len;
        pcStack_b0 = local_c8._M_str;
        cmJoin<(anonymous_namespace)::Args>((string *)local_a0,(Args *)local_50,local_c8);
        progressStr_1.field_2._M_local_buf[0xf] = '\x01';
        pjVar4 = (json_error *)__cxa_allocate_exception(0x28);
        local_f8 = (string_view)::cm::operator____s("member \'",8);
        local_118[0] = (string_view)::cm::operator____s("\' not found",0xb);
        cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
                  (&local_e8,(static_string_view *)&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   (static_string_view *)local_118);
        std::optional<(anonymous_namespace)::Args>::optional<(anonymous_namespace)::Args_&,_true>
                  ((optional<(anonymous_namespace)::Args> *)&local_130._M_value,(Args *)local_50);
        errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current =
             local_130._M_value.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .End._M_current;
        errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current =
             local_130._M_value.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .Begin._M_current;
        errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = local_120;
        json_error::json_error(pjVar4,&local_e8,errorPath);
        progressStr_1.field_2._M_local_buf[0xf] = '\0';
        __cxa_throw(pjVar4,&(anonymous_namespace)::json_error::typeinfo,json_error::~json_error);
      }
      curr._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Json::Value::operator[]
                     (curr._M_current,
                      progress.
                      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .End._M_current);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

Json::Value& ResolvePath(Json::Value& json, Args path)
{
  Json::Value* search = &json;

  for (auto curr = path.begin(); curr != path.end(); ++curr) {
    const std::string& field = *curr;
    Args progress{ path.begin(), curr + 1 };

    if (search->isArray()) {
      auto index = ParseIndex(field, progress, search->size());
      search = &(*search)[index];

    } else if (search->isObject()) {
      if (!search->isMember(field)) {
        const auto progressStr = cmJoin(progress, " "_s);
        throw json_error(cmStrCat("member '"_s, progressStr, "' not found"_s),
                         progress);
      }
      search = &(*search)[field];
    } else {
      const auto progressStr = cmJoin(progress, " "_s);
      throw json_error(
        cmStrCat("invalid path '"_s, progressStr,
                 "', need element of OBJECT or ARRAY type to lookup '"_s,
                 field, "' got "_s, JsonTypeToString(search->type())),
        progress);
    }
  }
  return *search;
}